

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

void __thiscall
ac::core::Image::create(Image *this,int w,int h,int c,ElementType elementType,int stride)

{
  int iVar1;
  int size;
  __shared_ptr<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  iVar1 = (elementType & 0xffU) * c * w;
  if (0 < stride) {
    iVar1 = stride;
  }
  if (0 < iVar1 * h) {
    this->w = w;
    this->h = h;
    this->c = c;
    this->elementType = elementType;
    this->pitch = iVar1;
    std::make_shared<ac::core::Image::ImageData,int&>((int *)&local_20);
    std::__shared_ptr<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->dptr).
                super___shared_ptr<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2>,&local_20
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
    this->pixels = ((this->dptr).
                    super___shared_ptr<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->data;
  }
  return;
}

Assistant:

void ac::core::Image::create(const int w, const int h, const int c, const ElementType elementType, const int stride)
{
    int pitch = stride > 0 ? stride : w * c * (elementType & 0xff);
    int size = h * pitch;
    if (!(size > 0)) return;
    this->w = w;
    this->h = h;
    this->c = c;
    this->elementType = elementType;
    this->pitch = pitch;
    this->dptr = std::make_shared<ImageData>(size);
    this->pixels = this->dptr->data;
}